

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O2

int CfdAddTapBranchByTapLeaf(void *handle,void *tree_handle,char *tapscript,uint8_t leaf_version)

{
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *this;
  bool bVar1;
  reference this_00;
  reference this_01;
  CfdException *this_02;
  allocator local_111;
  Script local_110;
  string local_d8;
  TaprootScriptTree leaf;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&leaf,"TapscriptTree",(allocator *)&local_110);
  cfd::capi::CheckBuffer(tree_handle,(string *)&leaf);
  std::__cxx11::string::~string((string *)&leaf);
  bVar1 = cfd::capi::IsEmptyString(tapscript);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_d8,tapscript,&local_111);
    cfd::core::Script::Script(&local_110,&local_d8);
    cfd::core::TaprootScriptTree::TaprootScriptTree(&leaf,leaf_version,&local_110);
    cfd::core::Script::~Script(&local_110);
    std::__cxx11::string::~string((string *)&local_d8);
    this = *(vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> **)
            ((long)tree_handle + 0x18);
    if ((this->super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>).
        _M_impl.super__Vector_impl_data._M_start ==
        (this->super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      this_01 = std::
                vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>
                ::at(*(vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>
                       **)((long)tree_handle + 0x10),0);
      cfd::core::TaprootScriptTree::AddBranch(this_01,&leaf);
    }
    else {
      this_00 = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::at(this,0)
      ;
      cfd::core::TapBranch::ToString_abi_cxx11_((string *)&local_110,this_00);
      std::__cxx11::string::~string((string *)&local_110);
      if (local_110.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start == (pointer)0x0) {
        cfd::core::TapBranch::operator=(this_00,&leaf.super_TapBranch);
      }
      else {
        cfd::core::TapBranch::AddBranch(this_00,&leaf.super_TapBranch);
      }
    }
    cfd::core::TaprootScriptTree::~TaprootScriptTree(&leaf);
    return 0;
  }
  leaf.super_TapBranch._vptr_TapBranch = (_func_int **)0x4fb1b0;
  leaf.super_TapBranch.has_leaf_ = true;
  leaf.super_TapBranch.leaf_version_ = '\x03';
  leaf.super_TapBranch._10_2_ = 0;
  leaf.super_TapBranch.script_._vptr_Script = (_func_int **)anon_var_dwarf_74a930;
  cfd::core::logger::warn<>((CfdSourceLocation *)&leaf,"tapscript is null or empty.");
  this_02 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&leaf,"Failed to parameter. tapscript is null or empty.",
             (allocator *)&local_110);
  cfd::core::CfdException::CfdException(this_02,kCfdIllegalArgumentError,(string *)&leaf);
  __cxa_throw(this_02,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddTapBranchByTapLeaf(
    void* handle, void* tree_handle, const char* tapscript,
    uint8_t leaf_version) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    if (IsEmptyString(tapscript)) {
      warn(CFD_LOG_SOURCE, "tapscript is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tapscript is null or empty.");
    }
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);
    TaprootScriptTree leaf(leaf_version, Script(tapscript));
    if (!buffer->branch_buffer->empty()) {
      auto& branch = buffer->branch_buffer->at(0);
      if (branch.ToString().empty()) {
        branch = leaf;  // override
      } else {
        branch.AddBranch(leaf);
      }
    } else {
      auto& tree = buffer->tree_buffer->at(0);
      tree.AddBranch(leaf);
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}